

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall YAML::BadFile::BadFile(BadFile *this,string *filename)

{
  undefined8 *in_RDI;
  Mark MVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  allocator<char> local_91;
  string local_90 [16];
  undefined8 in_stack_ffffffffffffff80;
  Mark *in_stack_ffffffffffffff88;
  Exception *in_stack_ffffffffffffff90;
  string local_50 [32];
  Mark local_30;
  undefined8 local_20;
  int local_18;
  
  MVar1 = Mark::null_mark();
  local_30.column = MVar1.column;
  local_18 = local_30.column;
  local_30._0_8_ = MVar1._0_8_;
  local_20._0_4_ = local_30.pos;
  local_20._4_4_ = local_30.line;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_91;
  local_30 = MVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"bad file",(allocator *)__rhs);
  std::operator+(in_stack_ffffffffffffff58,(char *)__rhs);
  std::operator+(in_stack_ffffffffffffff58,__rhs);
  Exception::Exception
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(string *)in_stack_ffffffffffffff80
            );
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  *in_RDI = &PTR__BadFile_01139a90;
  return;
}

Assistant:

BadFile(const BadFile&) = default;